

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O2

spawn_ret_t depspawn::spawn<boost::function<void(int&)>,int&>(function<void_(int_&)> *f,int *args)

{
  Workitem *ctx;
  Task *itask;
  int nargs;
  arg_info *pargs;
  int local_34;
  arg_info *local_30;
  reference_wrapper<int> local_28;
  
  local_30 = (arg_info *)0x0;
  local_34 = internal::
             fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&),boost::add_reference<mpl_::arg<_1>>>,0l>,int&>
                       (&local_30,args);
  if ((internal::TP == (TaskPool *)0x0) || (internal::TP->finish_ == true)) {
    internal::start_master();
  }
  ctx = LinkedListPool<depspawn::internal::Workitem,true,false>::
        malloc<depspawn::internal::arg_info*&,int_const&>
                  ((LinkedListPool<depspawn::internal::Workitem,true,false> *)
                   internal::Workitem::Pool,&local_30,&local_34);
  local_28._M_data = args;
  itask = internal::TaskPool::
          build_task<boost::function<void(int&)>const&,std::reference_wrapper<int>>
                    (internal::TP,ctx,f,&local_28);
  internal::Workitem::insert_in_worklist(ctx,itask);
  return;
}

Assistant:

inline internal::spawn_ret_t spawn(const Function& f, Args&&... args) {
    using parameter_types = typename internal::ParameterTypes<Function>::type;

    internal::arg_info *pargs = nullptr;
    const int nargs = internal::fill_args<typename boost::mpl::begin<parameter_types>::type>(pargs, std::forward<Args>(args)...);

#ifdef DEPSPAWN_USE_TBB
    if(!internal::master_task)
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(new (tbb::task::allocate_additional_child_of(*internal::master_task)) internal::runner<decltype(std::bind(f, internal::ref<Args&&>::make(args)...))>(w, f, std::forward<Args>(args)...));
#else
    if(!internal::TP || !internal::TP->is_running())
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(internal::TP->build_task(w, f, internal::ref<Args&&>::make(args)...));
#endif
  }